

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Psbt::GetDataSize(Psbt *this)

{
  wally_psbt *psbt;
  uint32_t uVar1;
  CfdException *this_00;
  allocator local_45;
  int ret;
  size_t size;
  ByteData data;
  size_t sVar2;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  size = 0;
  if ((psbt == (wally_psbt *)0x0) || (psbt->num_inputs != 0)) {
    ret = wally_psbt_get_length(psbt,0,&size);
    if (ret != 0) {
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x7f6;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "GetDataSize";
      logger::warn<int&>((CfdSourceLocation *)&data,"wally_psbt_get_length NG[{}]",&ret);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&data,"psbt get length error.",&local_45);
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&data);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar1 = (uint32_t)size;
  }
  else {
    CreatePsbtOutputOnlyData(&data,psbt);
    sVar2 = ByteData::GetDataSize(&data);
    uVar1 = (uint32_t)sVar2;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::GetDataSize() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t size = 0;

  if ((psbt_pointer != nullptr) && (psbt_pointer->num_inputs == 0)) {
    auto data = CreatePsbtOutputOnlyData(psbt_pointer);
    return static_cast<uint32_t>(data.GetDataSize());
  }

  int ret = wally_psbt_get_length(psbt_pointer, 0, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt get length error.");
  }
  return static_cast<uint32_t>(size);
}